

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::basic_ubjson_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_ubjson_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
          (basic_ubjson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,
          ubjson_decode_options *options,allocator<char> *alloc)

{
  uint uVar1;
  allocator<char> *in_RDX;
  ubjson_decode_options *in_RSI;
  basic_staj_visitor<char> *in_RDI;
  basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_> *unaff_retaddr;
  basic_staj_visitor<char> *source_00;
  
  source_00 = in_RDI;
  ser_context::ser_context((ser_context *)&in_RDI[2].data_.data_);
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)in_RDI);
  (in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor = (_func_int **)(vtable + 0x18);
  in_RDI[2].data_.data_.uint8_data_ = vtable + 0xb8;
  basic_ubjson_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_ubjson_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (unaff_retaddr,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)source_00,in_RSI
             ,in_RDX);
  basic_staj_visitor<char>::basic_staj_visitor(in_RDI);
  *(undefined1 *)&in_RDI[2].data_.type_ = 0;
  basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_>::cursor_mode
            ((basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_> *)&in_RDI->event_,
             true);
  uVar1 = (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])();
  }
  return;
}

Assistant:

basic_ubjson_cursor(Sourceable&& source,
        const ubjson_decode_options& options = ubjson_decode_options(),
        const Allocator& alloc = Allocator())
       : parser_(std::forward<Sourceable>(source), options, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }